

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue JS_ThrowError2(JSContext *ctx,JSErrorEnum error_num,char *fmt,__va_list_tag *ap,
                      BOOL add_backtrace)

{
  JSValue val;
  int iVar1;
  __gnuc_va_list in_RCX;
  char *in_RDX;
  JSContext *in_RDI;
  int in_R8D;
  JSValue JVar2;
  JSValue obj;
  char buf [256];
  JSValue ret;
  JSContext *in_stack_fffffffffffffe60;
  JSValue in_stack_fffffffffffffe68;
  JSValue in_stack_fffffffffffffe78;
  JSValueUnion local_168;
  JSValueUnion JVar3;
  int64_t in_stack_fffffffffffffeb8;
  JSValue in_stack_fffffffffffffec0;
  int in_stack_fffffffffffffee0;
  int in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  char *in_stack_ffffffffffffff38;
  JSContext *in_stack_ffffffffffffff40;
  JSValue in_stack_ffffffffffffff48;
  
  vsnprintf(&stack0xfffffffffffffeb8,0x100,in_RDX,in_RCX);
  JVar2 = JS_NewObjectProtoClass
                    ((JSContext *)in_stack_fffffffffffffe68.tag,in_stack_fffffffffffffe78,
                     in_stack_fffffffffffffe68.u._4_4_);
  local_168 = JVar2.u;
  JVar3 = (JSValueUnion)JVar2.tag;
  iVar1 = JS_IsException(JVar2);
  if (iVar1 == 0) {
    JS_NewString((JSContext *)in_stack_fffffffffffffe68.tag,(char *)in_stack_fffffffffffffe68.u.ptr)
    ;
    val.tag = in_stack_fffffffffffffeb8;
    val.u.float64 = JVar3.float64;
    JS_DefinePropertyValue
              ((JSContext *)local_168.ptr,in_stack_fffffffffffffec0,JVar2.tag._4_4_,val,
               in_stack_fffffffffffffee0);
    in_stack_fffffffffffffe60 = in_RDI;
  }
  if (in_R8D != 0) {
    build_backtrace(in_stack_ffffffffffffff40,in_stack_ffffffffffffff48,in_stack_ffffffffffffff38,
                    in_stack_ffffffffffffff34,in_stack_ffffffffffffff30);
  }
  JVar2 = JS_Throw(in_stack_fffffffffffffe60,in_stack_fffffffffffffe68);
  return JVar2;
}

Assistant:

static JSValue JS_ThrowError2(JSContext *ctx, JSErrorEnum error_num,
                              const char *fmt, va_list ap, BOOL add_backtrace)
{
    char buf[256];
    JSValue obj, ret;

    vsnprintf(buf, sizeof(buf), fmt, ap);
    obj = JS_NewObjectProtoClass(ctx, ctx->native_error_proto[error_num],
                                 JS_CLASS_ERROR);
    if (unlikely(JS_IsException(obj))) {
        /* out of memory: throw JS_NULL to avoid recursing */
        obj = JS_NULL;
    } else {
        JS_DefinePropertyValue(ctx, obj, JS_ATOM_message,
                               JS_NewString(ctx, buf),
                               JS_PROP_WRITABLE | JS_PROP_CONFIGURABLE);
    }
    if (add_backtrace) {
        build_backtrace(ctx, obj, NULL, 0, 0);
    }
    ret = JS_Throw(ctx, obj);
    return ret;
}